

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O0

CHAR CNNModelPredictBinary56(CharCNNClassifier *model,IplImage *pImage)

{
  long lVar1;
  int iVar2;
  undefined8 uStack_a0;
  undefined1 auStack_98 [8];
  undefined1 *local_90;
  long local_88;
  long local_80;
  ulong local_70;
  unsigned_long __vla_expr2;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  int local_4c;
  int local_48;
  int value;
  int max;
  int sum;
  int image_index_position;
  int map_index_position;
  INT8U output_col;
  int iStack_30;
  INT8U output_row;
  int k;
  int j;
  int i;
  int col;
  int row;
  IplImage *pImage_local;
  CharCNNClassifier *model_local;
  
  __vla_expr0 = (unsigned_long)auStack_98;
  __vla_expr1 = (unsigned_long)((model->model_binary_56).C11.outChannels * 0xa9);
  local_90 = auStack_98 + -(__vla_expr1 * 4 + 0xf & 0xfffffffffffffff0);
  __vla_expr2 = (unsigned_long)(model->model_binary_56).FC1.inputNum;
  local_88 = (long)local_90 - (__vla_expr2 * 4 + 0xf & 0xfffffffffffffff0);
  local_70 = (ulong)(model->model_binary_56).FC1.outputNum;
  lVar1 = local_88 - (local_70 * 4 + 0xf & 0xfffffffffffffff0);
  image_index_position._3_1_ = 0xd;
  image_index_position._2_1_ = 0xd;
  local_80 = lVar1;
  _col = pImage;
  pImage_local = (IplImage *)model;
  for (map_index_position = 0;
      (uint)map_index_position < *(uint *)((long)&pImage_local[0xf].imageData + 4);
      map_index_position = map_index_position + 1) {
    for (k = 0; k < (int)(uint)image_index_position._3_1_; k = k + 1) {
      for (iStack_30 = 0; iStack_30 < (int)(uint)image_index_position._2_1_;
          iStack_30 = iStack_30 + 1) {
        value = 0;
        for (i = 0; (uint)i < pImage_local[0x10].widthStep; i = i + 1) {
          for (j = 0; (uint)j < *(uint *)&pImage_local[0x10].imageData; j = j + 1) {
            sum = map_index_position * 9 + i * *(int *)&pImage_local[0x10].imageData + j;
            max = (k + i) * _col->widthStep + iStack_30 + j;
            value = Binary56_C11_Map_Weight[sum] * (uint)_col->imageData[max] + value;
          }
        }
        iVar2 = value + Binary56_C11_B_Weight[map_index_position];
        *(undefined8 *)(lVar1 + -8) = 0x103c9b;
        iVar2 = TanhApproximateFunction(iVar2);
        *(int *)(local_90 +
                (long)(int)(map_index_position * (uint)image_index_position._3_1_ *
                            (uint)image_index_position._3_1_ + k * (uint)image_index_position._3_1_
                           + iStack_30) * 4) = iVar2;
      }
    }
  }
  image_index_position._3_1_ = 6;
  image_index_position._2_1_ = 6;
  for (map_index_position = 0;
      (uint)map_index_position < *(uint *)((long)&pImage_local[0xf].imageData + 4);
      map_index_position = map_index_position + 1) {
    for (k = 0; k < 6; k = k + 1) {
      for (iStack_30 = 0; iStack_30 < 6; iStack_30 = iStack_30 + 1) {
        local_48 = -10;
        for (i = 0; i < 2; i = i + 1) {
          for (j = 0; j < 2; j = j + 1) {
            local_4c = *(int *)(local_90 +
                               (long)(map_index_position * 0xa9 + (k * 2 + i) * 0xd +
                                     iStack_30 * 2 + j) * 4);
            if (local_48 < local_4c) {
              local_48 = local_4c;
            }
          }
        }
        *(int *)(local_88 + (long)(map_index_position * 0x24 + k * 6 + iStack_30) * 4) = local_48;
      }
    }
  }
  for (i = 0; (uint)i < pImage_local[0x16].height; i = i + 1) {
    value = 0;
    for (j = 0; (uint)j < *(uint *)((long)&pImage_local[0x15].imageData + 4); j = j + 1) {
      value = *(int *)(local_88 + (long)j * 4) *
              Binary56_FC1_Map_Weight
              [(uint)(i * *(int *)((long)&pImage_local[0x15].imageData + 4) + j)] + value;
    }
    iVar2 = value + Binary56_FC1_B_Weight[i];
    *(undefined8 *)(lVar1 + -8) = 0x103e91;
    iVar2 = TanhApproximateFunction(iVar2);
    *(int *)(local_80 + (long)i * 4) = iVar2;
  }
  local_48 = -10000;
  map_index_position = 0;
  for (i = 0; (uint)i < *(uint *)&pImage_local[0x16].imageData; i = i + 1) {
    value = 0;
    for (j = 0; (uint)j < pImage_local[0x16].widthStep; j = j + 1) {
      value = *(int *)(local_80 + (long)j * 4) *
              Binary56_FC2_Map_Weight[i * pImage_local[0x16].widthStep + j] + value;
    }
    if (local_48 < value + Binary56_FC2_B_Weight[i]) {
      map_index_position = i;
      local_48 = value + Binary56_FC2_B_Weight[i];
    }
  }
  if (map_index_position == 0) {
    model_local._7_1_ = '\x05';
  }
  else {
    model_local._7_1_ = '\x06';
  }
  return model_local._7_1_;
}

Assistant:

CHAR CNNModelPredictBinary56(CharCNNClassifier *model, IplImage *pImage) {
    int row, col, i, j, k;
    INT8U output_row, output_col;
    int map_index_position, image_index_position;
    int sum, max, value;
    int c11_output[model->model_binary_56.C11.outChannels * 13 * 13];
//    int c21_output[25 * 11 * 11], c31_output[25 * 9 * 9];
    int merge_output[model->model_binary_56.FC1.inputNum];
    int fc1_output[model->model_binary_56.FC1.outputNum];
// convolution - layer
//    3*3
//    15-3+1=13
    output_row = 13;
    output_col = 13;
    for (k = 0; k < model->model_binary_56.C11.outChannels; k++) {
//        for each filters
        for (i = 0; i < output_row; i++) {
            //        i represents start point in row
            for (j = 0; j < output_col; j++) {
                //        j represents start point in col
                sum = 0;
                for (row = 0; row < model->model_binary_56.C11.height; row++) {
                    for (col = 0; col < model->model_binary_56.C11.widthStep; col++) {
                        //      index position
                        map_index_position = k * 3 * 3 + row * model->model_binary_56.C11.widthStep + col;
                        image_index_position = (i + row) * pImage->widthStep + (j + col);
//                        printf("%d,%d\n", map_index_position, image_index_position);
//                        printf("%ld,%d,%ld\n", C11_Map_Weight[map_index_position],
//                               pImage->imageData[image_index_position],
//                               C11_Map_Weight[map_index_position] * pImage->imageData[image_index_position]);
                        sum += Binary56_C11_Map_Weight[map_index_position] * pImage->imageData[image_index_position];
                    }
                }
                c11_output[k * output_row * output_row + i * output_row + j] = TanhApproximateFunction(
                        sum + Binary56_C11_B_Weight[k]);
//                printf("%ld\n",sum + C11_B_Weight[k]);
            }
        }
//                printmat(pImage);
//        printmat2(c11_output, 13, 13);
//                printf("%f",sum);
//                printf("%f",c11_output[k * 13 * 13 + i * 13 + j]);
//        assert(NULL);
    }


    output_row = 6;
    output_col = 6;
    for (k = 0; k < model->model_binary_56.C11.outChannels; k++) {
//        for each filters
        for (i = 0; i < output_row; i++) {
            //        i represents start point in row
            for (j = 0; j < output_col; j++) {
                //        j represents start point in col
                max = -10;
                for (row = 0; row < 2; row++) {
                    for (col = 0; col < 2; col++) {
                        value = c11_output[k * 13 * 13 + (2 * i + row) * 13 + (2 * j + col)];
                        if (value > max) {
                            max = value;
                        }

                    }
                }
                merge_output[k * 6 * 6 + i * 6 + j] = max;
            }
        }
//        printmat2(merge_output, 6, 6);
//                printf("%f",sum);
//                printf("%f",c11_output[k * 13 * 13 + i * 13 + j]);
//        assert(NULL);
    }
    //endregion


    //region FC1 - 360*40

    for (row = 0; row < model->model_binary_56.FC1.outputNum; row++) {
        sum = 0;
        for (col = 0; col < model->model_binary_56.FC1.inputNum; col++) {
            sum += merge_output[col] * Binary56_FC1_Map_Weight[row * model->model_binary_56.FC1.inputNum + col];
        }
//        fc1_output[row] = tanhf(sum + FC1_B_Weight[row]);
        fc1_output[row] = TanhApproximateFunction(sum + Binary56_FC1_B_Weight[row]);
//        fc1_output[row] = sum + FC1_B_Weight[row];
    }
    //endregion

//    for (col = 0; col < model->model_binary_56.FC2.inputNum; col++) {
//        printf("%f,",fc1_output[col]);
//    }
//    printf("\n");
//
//    for (col = 0; col < model->model_binary_56.FC2.inputNum; col++) {
//        printf("%f,",FC2_Map_Weight[7*model->model_binary_56.FC2.inputNum+col]);
//    }
//    printf("\n");
//    for (col = 0; col < model->model_binary_56.FC2.inputNum; col++) {
//        printf("%f,",FC2_Map_Weight[33*model->model_binary_56.FC2.inputNum+col]);
//    }
//    printf("\n");
    //region FC2 - 40*34
    max = -10000;
    k = 0;

    for (row = 0; row < model->model_binary_56.FC2.outputNum; row++) {
        sum = 0;
        for (col = 0; col < model->model_binary_56.FC2.inputNum; col++) {
//            printf("%d,%d\n",fc1_output[col],FC2_Map_Weight[row * model->model_binary_56.FC2.inputNum + col]);
            sum += fc1_output[col] * Binary56_FC2_Map_Weight[row * model->model_binary_56.FC2.inputNum + col];
        }
        value = sum + Binary56_FC2_B_Weight[row];
//        printf("%ld\n",value);
        if (value > max) {
            max = value;
            k = row;
        }
    }
    //endregion

//    printf("%f,%d\n",max,k);
    if (k == 0)
        return 5;
    else
        return 6;
//    return '1' ;
}